

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TypeEntry::~TypeEntry(TypeEntry *this)

{
  TypeEntry *this_local;
  
  this->_vptr_TypeEntry = (_func_int **)&PTR__TypeEntry_0034c0f8;
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual ~TypeEntry() = default;